

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O1

int XNVCTRLQueryExtension(Display *dpy,int *event_basep,int *error_basep)

{
  XExtCodes *pXVar1;
  int iVar2;
  XExtDisplayInfo *pXVar3;
  
  pXVar3 = find_display(dpy);
  iVar2 = 0;
  if ((pXVar3 != (XExtDisplayInfo *)0x0) &&
     (pXVar1 = pXVar3->codes, iVar2 = 0, pXVar1 != (XExtCodes *)0x0)) {
    if (event_basep != (int *)0x0) {
      *event_basep = pXVar1->first_event;
    }
    iVar2 = 1;
    if (error_basep != (int *)0x0) {
      *error_basep = pXVar1->first_error;
    }
  }
  return iVar2;
}

Assistant:

Bool XNVCTRLQueryExtension (
    Display *dpy,
    int *event_basep,
    int *error_basep
){
    XExtDisplayInfo *info = find_display (dpy);

    if (XextHasExtension(info)) {
        if (event_basep) *event_basep = info->codes->first_event;
        if (error_basep) *error_basep = info->codes->first_error;
        return True;
    } else {
        return False;
    }
}